

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.c
# Opt level: O1

int testIncorrectDecode(char *mc,Territory tc)

{
  MapcodeError MVar1;
  double lon;
  double lat;
  double dStack_28;
  double local_20;
  
  MVar1 = decodeMapcodeToLatLonUtf8(&local_20,&dStack_28,mc,tc,(MapcodeElements *)0x0);
  if (~ERR_OK < MVar1) {
    pthread_mutex_lock((pthread_mutex_t *)&mutex);
    nrErrors = nrErrors + 1;
    pthread_mutex_unlock((pthread_mutex_t *)&mutex);
    MVar1 = printf("*** ERROR *** decodeMapcodeToLatLonUtf8 returns \'%d\' (should be non-0) for mapcode=\'%s\'\n"
                   ,(ulong)(uint)MVar1,mc);
  }
  return MVar1;
}

Assistant:

static int testIncorrectDecode(char *mc, enum Territory tc) {
    double lat;
    double lon;
    int rc = decodeMapcodeToLatLonUtf8(&lat, &lon, mc, tc, NULL);
    if (rc >= 0) {
        foundError();
        printf("*** ERROR *** decodeMapcodeToLatLonUtf8 returns '%d' (should be non-0) for mapcode='%s'\n", rc, mc);
    }
    return 1;
}